

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EqualMatch.cpp
# Opt level: O2

unique_ptr<const_oout::Result,_std::default_delete<const_oout::Result>_> __thiscall
oout::EqualMatch::match(EqualMatch *this,shared_ptr<const_oout::Text> *in)

{
  undefined1 auVar1 [8];
  ostream *poVar2;
  undefined8 *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *__rhs;
  string origin;
  ostringstream message;
  undefined1 local_1e1 [9];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1d8;
  undefined1 local_1d0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  string local_1a8 [32];
  ostringstream local_188 [376];
  
  (**(code **)(*(long *)*in_RDX + 0x10))(local_1d0 + 8);
  std::__cxx11::ostringstream::ostringstream(local_188);
  poVar2 = std::operator<<((ostream *)local_188,"\'");
  poVar2 = std::operator<<(poVar2,(string *)(local_1d0 + 8));
  poVar2 = std::operator<<(poVar2,"\' is equal \'");
  __rhs = &(in->super___shared_ptr<const_oout::Text,_(__gnu_cxx::_Lock_policy)2>)._M_refcount;
  poVar2 = std::operator<<(poVar2,(string *)__rhs);
  std::operator<<(poVar2,"\'");
  local_1e1[0] = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)(local_1d0 + 8),
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)__rhs);
  std::__cxx11::stringbuf::str();
  std::make_shared<oout::CondResult,bool,std::__cxx11::string>
            ((bool *)(local_1e1 + 1),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e1);
  std::make_unique<oout::TestResult,std::shared_ptr<oout::CondResult>>
            ((shared_ptr<oout::CondResult> *)local_1d0);
  auVar1 = local_1d0;
  local_1d0 = (undefined1  [8])0x0;
  (this->super_Match)._vptr_Match = (_func_int **)auVar1;
  std::unique_ptr<oout::TestResult,_std::default_delete<oout::TestResult>_>::~unique_ptr
            ((unique_ptr<oout::TestResult,_std::default_delete<oout::TestResult>_> *)local_1d0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1d8);
  std::__cxx11::string::~string(local_1a8);
  std::__cxx11::ostringstream::~ostringstream(local_188);
  std::__cxx11::string::~string((string *)(local_1d0 + 8));
  return (__uniq_ptr_data<const_oout::Result,_std::default_delete<const_oout::Result>,_true,_true>)
         (__uniq_ptr_data<const_oout::Result,_std::default_delete<const_oout::Result>,_true,_true>)
         this;
}

Assistant:

unique_ptr<const Result> EqualMatch::match(const shared_ptr<const Text> &in) const
{
	const auto origin = in->asString();
	ostringstream message;
	message << "'" << origin << "' is equal '" << text << "'";
	return make_unique<TestResult>(
		make_shared<CondResult>(origin == text, message.str())
	);
}